

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3p.cc
# Opt level: O0

void lambdatwist::compute_eig3x3known0(Matrix3d *M,Matrix3d *E,double *sig1,double *sig2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  CoeffReturnType pdVar4;
  double *in_RCX;
  double *in_RDX;
  int in_EDI;
  double dVar5;
  double dVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double n;
  double a2;
  double a1;
  double c;
  double tmp;
  double disc;
  double p0;
  double p1;
  Index in_stack_fffffffffffffce8;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *in_stack_fffffffffffffcf0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *this;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffcf8;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this_00;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
  *in_stack_fffffffffffffd00;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *this_01;
  
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1704fb);
  dVar6 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170534);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17055f);
  dVar5 = (-dVar6 - dVar1) - *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17058b);
  dVar6 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1705c5);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1705e8);
  dVar9 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17060b);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170669);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17068d);
  dVar8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1706df);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170701);
  dVar10 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170723);
  dVar2 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170768);
  dVar3 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17078a);
  dVar6 = sqrt((dVar5 * dVar5) / 4.0 -
               (dVar3 * *pdVar4 +
               dVar7 * (dVar10 + dVar2) + -dVar12 * dVar8 + -dVar6 * dVar1 + -(dVar9 * dVar11)));
  *in_RDX = -dVar5 / 2.0 + dVar6;
  *in_RCX = -dVar5 / 2.0 - dVar6;
  std::abs(in_EDI);
  std::abs(in_EDI);
  if (extraout_XMM0_Qa < extraout_XMM0_Qa_00) {
    std::swap<double>(in_RDX,in_RCX);
  }
  dVar6 = *in_RDX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1708d7);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170901);
  dVar9 = *pdVar4;
  dVar11 = *in_RDX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170959);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x17097e);
  dVar8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1709cf);
  dVar7 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x1709f9);
  dVar7 = ((dVar6 * dVar6 + dVar1 * dVar9) - dVar11 * (dVar12 + dVar8)) - dVar7 * *pdVar4;
  dVar6 = *in_RDX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170a57);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170a81);
  dVar9 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170aab);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170afc);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170b21);
  dVar8 = ((dVar6 * dVar1 + dVar9 * dVar11) - dVar12 * *pdVar4) / dVar7;
  dVar6 = *in_RDX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170b87);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170bb1);
  dVar9 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170bdb);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170c27);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,0x170c51);
  dVar7 = ((dVar6 * dVar1 + dVar9 * dVar11) - dVar12 * *pdVar4) / dVar7;
  sqrt(dVar7 * dVar7 + dVar8 * dVar8 + 1.0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_fffffffffffffd00,
             (Index)in_stack_fffffffffffffcf8);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator<<
            (in_stack_fffffffffffffcf8,(Scalar *)in_stack_fffffffffffffcf0);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  operator_(in_stack_fffffffffffffd00,(Scalar *)in_stack_fffffffffffffcf8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  operator_(in_stack_fffffffffffffd00,(Scalar *)in_stack_fffffffffffffcf8);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                     *)0x170da1);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)*in_RCX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,in_stack_fffffffffffffce8,0x170dcc);
  dVar6 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170df2);
  dVar11 = dVar6 * *pdVar4;
  dVar9 = (double)this * (double)this;
  this_01 = (CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
            *in_RCX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170e3a);
  this_00 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)*pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170e5c);
  dVar12 = (double)this_01 * ((double)this_00 + *pdVar4);
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170e9e);
  dVar1 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170ec2);
  dVar10 = ((dVar9 + dVar11) - dVar12) - dVar1 * *pdVar4;
  dVar1 = *in_RCX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170f14);
  dVar9 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170f38);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170f5f);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170fa1);
  dVar8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x170fc3);
  dVar7 = ((dVar1 * dVar9 + dVar11 * dVar12) - dVar8 * *pdVar4) / dVar10;
  dVar1 = *in_RCX;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x171020);
  dVar9 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x171044);
  dVar11 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x171068);
  dVar12 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x1710a8);
  dVar8 = *pdVar4;
  pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this,(Index)dVar6,0x1710d2);
  dVar10 = ((dVar1 * dVar9 + dVar11 * dVar12) - dVar8 * *pdVar4) / dVar10;
  sqrt(dVar10 * dVar10 + dVar7 * dVar7 + 1.0);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::col
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_01,(Index)this_00);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::operator<<
            (this_00,(Scalar *)this);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  operator_(this_01,(Scalar *)this_00);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  operator_(this_01,(Scalar *)this_00);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>::
  ~CommaInitializer((CommaInitializer<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_>
                     *)0x171222);
  return;
}

Assistant:

void compute_eig3x3known0(const Eigen::Matrix3d &M, Eigen::Matrix3d &E, double &sig1, double &sig2) {

    // In the original paper there is a missing minus sign here (for M(0,0))
    double p1 = -M(0,0) - M(1,1) - M(2,2);
    double p0 = -M(0,1)*M(0,1) - M(0,2)*M(0,2) - M(1,2)*M(1,2) + M(0,0) * (M(1,1) + M(2,2)) + M(1,1)*M(2,2);

    double disc = std::sqrt(p1*p1/4.0 - p0);
    double tmp = -p1/2.0;
    sig1 = tmp + disc;
    sig2 = tmp - disc;

    if(std::abs(sig1) < std::abs(sig2))
        std::swap(sig1,sig2);

    double c = sig1*sig1 + M(0,0)*M(1,1) - sig1 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    double a1 = (sig1 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    double a2 = (sig1 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    double n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(0) << a1*n, a2*n, n;

    c = sig2*sig2 + M(0,0)*M(1,1) - sig2 * (M(0,0) + M(1,1)) - M(0,1)*M(0,1);
    a1 = (sig2 * M(0,2) + M(0,1)*M(1,2) - M(0,2) * M(1,1)) / c;
    a2 = (sig2 * M(1,2) + M(0,1)*M(0,2) - M(0,0) * M(1,2)) / c;
    n = 1.0 / std::sqrt(1 + a1*a1 + a2*a2);
    E.col(1) << a1*n, a2*n, n;

    // This is never used so we don't compute it
    //E.col(2) = M.col(1).cross(M.col(2)).normalized();
}